

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O1

void move_cursor_relative(wchar_t y,wchar_t x)

{
  term_conflict *t;
  ulong uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  chunk_conflict *pcVar4;
  term *t_00;
  int iVar5;
  wchar_t j;
  long lVar6;
  wchar_t wVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  wchar_t y_00;
  uint uVar12;
  wchar_t map_height;
  wchar_t map_width;
  int local_38;
  int local_34;
  
  lVar6 = 0;
  do {
    pcVar4 = cave;
    uVar3 = tile_width;
    uVar2 = tile_height;
    t = (term_conflict *)angband_term[lVar6];
    if ((t != (term_conflict *)0x0) && ((window_flag[lVar6] & 0xa0) != 0)) {
      if ((window_flag[lVar6] & 0x20) == 0) {
        y_00 = (uint)(byte)(tile_height + (tile_height == '\0')) * (y - t->offset_y);
        wVar7 = x - t->offset_x;
        if (1 < tile_width) {
          wVar7 = wVar7 * (uint)tile_width;
        }
      }
      else {
        wVar7 = (wchar_t)tile_height;
        uVar12 = (uint)tile_width;
        get_minimap_dimensions(t,(chunk *)cave,(uint)tile_width,wVar7,&local_34,&local_38);
        uVar1 = (long)(local_38 * y) / (long)pcVar4->height;
        iVar11 = (int)uVar1;
        if (1 < uVar2) {
          iVar11 = iVar11 - (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar1 & 0xffffffff)
                                 % (long)wVar7);
        }
        uVar1 = (long)(local_34 * x) / (long)pcVar4->width;
        iVar8 = (int)uVar1;
        if (1 < uVar3) {
          iVar8 = iVar8 - (int)((long)((ulong)(uint)(iVar8 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                               (long)(int)uVar12);
        }
        y_00 = iVar11 + L'\x01';
        wVar7 = iVar8 + L'\x01';
      }
      t_00 = Term;
      if ((((L'\xffffffff' < y_00) && (y_00 < t->hgt)) && (L'\xffffffff' < wVar7)) &&
         (wVar7 < t->wid)) {
        Term_activate((term *)t);
        Term_gotoxy(wVar7,y_00);
        Term_activate(t_00);
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  iVar11 = y - Term->offset_y;
  if (-1 < iVar11) {
    iVar8 = Term->sidebar_mode;
    if (iVar11 < (Term->hgt - (row_bottom_map[iVar8] + row_top_map[iVar8])) / (int)(uint)tile_height
       ) {
      iVar5 = x - Term->offset_x;
      if (-1 < iVar5) {
        if (iVar5 < (~col_map[iVar8] + Term->wid) / (int)(uint)tile_width) {
          iVar10 = (tile_width - 1) * iVar5;
          if (tile_width < 2) {
            iVar10 = 0;
          }
          iVar9 = (tile_height - 1) * iVar11;
          if (tile_height < 2) {
            iVar9 = 0;
          }
          Term_gotoxy(iVar10 + col_map[iVar8] + iVar5,iVar9 + row_top_map[iVar8] + iVar11);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void move_cursor_relative(int y, int x)
{
	int ky, kx;
	int vy, vx;

	/* Move the cursor on map sub-windows */
	move_cursor_relative_map(y, x);

	/* Location relative to panel */
	ky = y - Term->offset_y;

	/* Verify location */
	if ((ky < 0) || (ky >= SCREEN_HGT)) return;

	/* Location relative to panel */
	kx = x - Term->offset_x;

	/* Verify location */
	if ((kx < 0) || (kx >= SCREEN_WID)) return;

	/* Location in window */
	vy = ky + ROW_MAP;

	/* Location in window */
	vx = kx + COL_MAP;

	if (tile_width > 1)
		vx += (tile_width - 1) * kx;

	if (tile_height > 1)
		vy += (tile_height - 1) * ky;

	/* Go there */
	(void)Term_gotoxy(vx, vy);
}